

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall OpenMD::ForceMatrixDecomposition::zeroWorkArrays(ForceMatrixDecomposition *this)

{
  iterator __first;
  Vector<double,_7U> *in_RDI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffffdc8;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  in_stack_fffffffffffffdd8;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  in_stack_fffffffffffffde0;
  double local_188;
  Vector<double,_7U> local_180;
  double local_148;
  Vector<double,_7U> local_140;
  double local_108;
  Vector<double,_7U> local_100;
  double local_c8;
  Vector<double,_7U> local_c0;
  double local_88;
  Vector<double,_7U> local_80;
  double local_48;
  Vector<double,_7U> local_40;
  
  local_48 = 0.0;
  Vector<double,_7U>::Vector(&local_40,&local_48);
  Vector<double,_7U>::operator=((Vector<double,_7U> *)in_stack_fffffffffffffdd8._M_current,in_RDI);
  local_88 = 0.0;
  Vector<double,_7U>::Vector(&local_80,&local_88);
  Vector<double,_7U>::operator=((Vector<double,_7U> *)in_stack_fffffffffffffdd8._M_current,in_RDI);
  local_c8 = 0.0;
  Vector<double,_7U>::Vector(&local_c0,&local_c8);
  Vector<double,_7U>::operator=((Vector<double,_7U> *)in_stack_fffffffffffffdd8._M_current,in_RDI);
  local_108 = 0.0;
  Vector<double,_7U>::Vector(&local_100,&local_108);
  Vector<double,_7U>::operator=((Vector<double,_7U> *)in_stack_fffffffffffffdd8._M_current,in_RDI);
  local_148 = 0.0;
  Vector<double,_7U>::Vector(&local_140,&local_148);
  Vector<double,_7U>::operator=((Vector<double,_7U> *)in_stack_fffffffffffffdd8._M_current,in_RDI);
  local_188 = 0.0;
  Vector<double,_7U>::Vector(&local_180,&local_188);
  Vector<double,_7U>::operator=((Vector<double,_7U> *)in_stack_fffffffffffffdd8._M_current,in_RDI);
  if (((ulong)in_RDI->data_[6] & 0x40) != 0) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffde0._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffdd8._M_current,in_RDI->data_);
  }
  if (((ulong)in_RDI->data_[6] & 0x80) != 0) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffde0._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffdd8._M_current,in_RDI->data_);
  }
  if (((ulong)in_RDI->data_[6] & 0x100) != 0) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffde0._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffdd8._M_current,in_RDI->data_);
  }
  if (((ulong)in_RDI->data_[6] & 0x200) != 0) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffde0._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffdd8._M_current,in_RDI->data_);
  }
  if (((ulong)in_RDI->data_[6] & 0x2000) != 0) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffde0._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffdd8._M_current,in_RDI->data_);
  }
  if (((ulong)in_RDI->data_[6] & 0x1000) != 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
              (in_stack_fffffffffffffdc8);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
              (in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<OpenMD::Vector3<double>*,std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>>,OpenMD::Vector3<double>>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(Vector3<double> *)in_RDI);
  }
  if (((ulong)in_RDI->data_[6] & 0x20000) != 0) {
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    __first = std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc8);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)0x0,
               in_RDI->data_);
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::zeroWorkArrays() {
    pairwisePot     = 0.0;
    selfPot         = 0.0;
    excludedPot     = 0.0;
    excludedSelfPot = 0.0;
    selectedPot     = 0.0;
    selectedSelfPot = 0.0;

#ifdef IS_MPI
    if (atomStorageLayout_ & DataStorage::dslForce) {
      fill(atomRowData.force.begin(), atomRowData.force.end(), V3Zero);
      fill(atomColData.force.begin(), atomColData.force.end(), V3Zero);
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      fill(atomRowData.torque.begin(), atomRowData.torque.end(), V3Zero);
      fill(atomColData.torque.begin(), atomColData.torque.end(), V3Zero);
    }

    fill(pot_row.begin(), pot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(pot_col.begin(), pot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(expot_row.begin(), expot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(expot_col.begin(), expot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(selepot_row.begin(), selepot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(selepot_col.begin(), selepot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      fill(atomRowData.particlePot.begin(), atomRowData.particlePot.end(), 0.0);
      fill(atomColData.particlePot.begin(), atomColData.particlePot.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      fill(atomRowData.density.begin(), atomRowData.density.end(), 0.0);
      fill(atomColData.density.begin(), atomColData.density.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      fill(atomRowData.functional.begin(), atomRowData.functional.end(), 0.0);
      fill(atomColData.functional.begin(), atomColData.functional.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      fill(atomRowData.functionalDerivative.begin(),
           atomRowData.functionalDerivative.end(), 0.0);
      fill(atomColData.functionalDerivative.begin(),
           atomColData.functionalDerivative.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      fill(atomRowData.skippedCharge.begin(), atomRowData.skippedCharge.end(),
           0.0);
      fill(atomColData.skippedCharge.begin(), atomColData.skippedCharge.end(),
           0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      fill(atomRowData.flucQFrc.begin(), atomRowData.flucQFrc.end(), 0.0);
      fill(atomColData.flucQFrc.begin(), atomColData.flucQFrc.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      fill(atomRowData.electricField.begin(), atomRowData.electricField.end(),
           V3Zero);
      fill(atomColData.electricField.begin(), atomColData.electricField.end(),
           V3Zero);
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      fill(atomRowData.sitePotential.begin(), atomRowData.sitePotential.end(),
           0.0);
      fill(atomColData.sitePotential.begin(), atomColData.sitePotential.end(),
           0.0);
    }

#endif
    // even in parallel, we need to zero out the local arrays:

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      fill(snap_->atomData.particlePot.begin(),
           snap_->atomData.particlePot.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      fill(snap_->atomData.density.begin(), snap_->atomData.density.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      fill(snap_->atomData.functional.begin(), snap_->atomData.functional.end(),
           0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      fill(snap_->atomData.functionalDerivative.begin(),
           snap_->atomData.functionalDerivative.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      fill(snap_->atomData.skippedCharge.begin(),
           snap_->atomData.skippedCharge.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      fill(snap_->atomData.electricField.begin(),
           snap_->atomData.electricField.end(), V3Zero);
    }
    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      fill(snap_->atomData.sitePotential.begin(),
           snap_->atomData.sitePotential.end(), 0.0);
    }
  }